

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O1

InPlaceOperator * __thiscall
soul::PoolAllocator::
allocate<soul::AST::InPlaceOperator,soul::AST::Context,soul::AST::Expression&,soul::AST::Expression&,soul::BinaryOp::Op&>
          (PoolAllocator *this,Context *args,Expression *args_1,Expression *args_2,Op *args_3)

{
  Op OVar1;
  SourceCodeText *pSVar2;
  PoolItem *pPVar3;
  
  pPVar3 = allocateSpaceForObject(this,0x48);
  OVar1 = *args_3;
  pPVar3->item = &PTR__ASTObject_002d4778;
  *(undefined4 *)&pPVar3->field_0x18 = 0x1d;
  pSVar2 = (args->location).sourceCode.object;
  pPVar3[1].size = (size_t)pSVar2;
  if (pSVar2 != (SourceCodeText *)0x0) {
    (pSVar2->super_RefCountedObject).refCount = (pSVar2->super_RefCountedObject).refCount + 1;
  }
  pPVar3[1].destructor = (DestructorFn *)(args->location).location.data;
  pPVar3[1].item = args->parentScope;
  *(undefined4 *)&pPVar3[1].field_0x18 = 0;
  pPVar3->item = &PTR__InPlaceOperator_002d5500;
  pPVar3[2].size = (size_t)args_1;
  pPVar3[2].destructor = (DestructorFn *)args_2;
  *(Op *)&pPVar3[2].item = OVar1;
  pPVar3->destructor =
       allocate<soul::AST::InPlaceOperator,_soul::AST::Context,_soul::AST::Expression_&,_soul::AST::Expression_&,_soul::BinaryOp::Op_&>
       ::anon_class_1_0_00000001::__invoke;
  return (InPlaceOperator *)&pPVar3->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }